

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatawriter.cpp
# Opt level: O0

ssize_t icu_63::CollationDataWriter::write(int __fd,void *__buf,size_t __n)

{
  long lVar1;
  char cVar2;
  UBool UVar3;
  int32_t iVar4;
  UnicodeSet *this;
  char16_t *src;
  CollationSettings *in_RCX;
  void *in_R8;
  int in_R9D;
  int32_t *in_stack_00000008;
  uint8_t *in_stack_00000010;
  int in_stack_00000018;
  UErrorCode *in_stack_00000020;
  ConstChar16Ptr local_178;
  ConstChar16Ptr local_170;
  undefined1 local_168 [8];
  UnicodeString scripts;
  uint16_t *p;
  int32_t length_1;
  UErrorCode errorCode2_1;
  int32_t length;
  UErrorCode errorCode2;
  int32_t totalSize;
  int32_t sum;
  DataHeader header;
  int32_t headerSize;
  int local_e4;
  int32_t i;
  int32_t reorderCodesLength;
  int32_t *reorderCodes;
  UVector32 codesAndRanges;
  int local_a8;
  uint local_a4;
  int32_t fastLatinTableLength;
  int32_t fastLatinVersion;
  CollationData *baseData;
  UnicodeSet unsafeBackwardSet;
  int local_38;
  UBool hasMappings;
  int32_t indexesLength;
  int32_t rootElementsLength_local;
  void *rootElements_local;
  CollationSettings *settings_local;
  CollationData *data_local;
  uint8_t *dataVersion_local;
  UBool isBase_local;
  
  cVar2 = (char)__fd;
  UVar3 = ::U_FAILURE(*in_stack_00000020);
  if (UVar3 != '\0') {
    dataVersion_local._4_4_ = 0;
    goto LAB_0030f87e;
  }
  if ((in_stack_00000018 < 0) || ((0 < in_stack_00000018 && (in_stack_00000010 == (uint8_t *)0x0))))
  {
    *in_stack_00000020 = U_ILLEGAL_ARGUMENT_ERROR;
    dataVersion_local._4_4_ = 0;
    goto LAB_0030f87e;
  }
  UnicodeSet::UnicodeSet((UnicodeSet *)&baseData);
  lVar1 = *(long *)(__n + 0x20);
  if (*(long *)(__n + 0x58) == 0) {
    local_a4 = 0;
  }
  else {
    local_a4 = 0x20000;
  }
  local_a8 = 0;
  if (cVar2 == '\0') {
    if (lVar1 == 0) {
      unsafeBackwardSet._87_1_ = 0;
      if (in_RCX->reorderCodesLength == 0) {
        local_38 = 2;
      }
      else {
        local_38 = 8;
      }
    }
    else {
      unsafeBackwardSet._87_1_ = 1;
      local_38 = 0xd;
      if (*(int *)(__n + 0x44) != 0) {
        local_38 = 0xf;
      }
      this = UnicodeSet::addAll((UnicodeSet *)&baseData,*(UnicodeSet **)(__n + 0x50));
      UnicodeSet::removeAll(this,*(UnicodeSet **)(lVar1 + 0x50));
      UVar3 = UnicodeSet::isEmpty((UnicodeSet *)&baseData);
      if (UVar3 == '\0') {
        local_38 = 0x10;
      }
      if (*(long *)(__n + 0x58) != *(long *)(lVar1 + 0x58)) {
        local_a8 = *(int *)(__n + 0x60);
        local_38 = 0x11;
      }
    }
  }
  else {
    local_38 = 0x14;
    unsafeBackwardSet._87_1_ = 1;
    UnicodeSet::operator=((UnicodeSet *)&baseData,*(UnicodeSet **)(__n + 0x50));
    local_a8 = *(int *)(__n + 0x60);
  }
  UVector32::UVector32((UVector32 *)&reorderCodes,in_stack_00000020);
  _i = in_RCX->reorderCodes;
  local_e4 = in_RCX->reorderCodesLength;
  UVar3 = CollationSettings::hasReordering(in_RCX);
  if ((UVar3 == '\0') ||
     (UVar3 = CollationSettings::reorderTableHasSplitBytes(in_RCX->reorderTable), UVar3 == '\0')) {
LAB_0030f01f:
    if (cVar2 == '\0') {
      totalSize._2_1_ = 0xda;
      totalSize._3_1_ = 0x27;
      sum = 0x14;
      header.dataHeader.headerSize = 0;
      header.dataHeader.magic1 = '\x02';
      header.dataHeader.magic2 = '\0';
      header.info.size = 0x4355;
      header.info.reservedWord = 0x6c6f;
      header.info.isBigEndian = '\x05';
      header.info.charsetFamily = '\0';
      header.info.sizeofUChar = '\0';
      header.info.reservedByte = '\0';
      header.info.dataFormat = *__buf;
      header.info.formatVersion[0] = '\x18';
      header.info.formatVersion[1] = '\0';
      header.info.formatVersion[2] = '\0';
      header.info.formatVersion[3] = '\0';
      if (((unsafeBackwardSet._87_1_ != '\0') && (*(int *)(__n + 0x40) != 0)) &&
         (errorCode2 = (local_38 + local_e4) * 4 + U_TOO_MANY_ALIASES_ERROR,
         (errorCode2 & U_MEMORY_ALLOCATION_ERROR) != U_ZERO_ERROR)) {
        header.info.formatVersion[0] = '\x1c';
        header.info.formatVersion[1] = '\0';
        header.info.formatVersion[2] = '\0';
        header.info.formatVersion[3] = '\0';
      }
      totalSize._0_2_ = header.info.formatVersion._0_2_;
      if (in_stack_00000018 < (int)header.info.formatVersion) {
        in_stack_00000010 = (uint8_t *)0x0;
        in_stack_00000018 = 0;
      }
      else {
        *(ulong *)in_stack_00000010 =
             CONCAT44(0x14,CONCAT13(0x27,CONCAT12(0xda,(undefined2)totalSize)));
        in_stack_00000010[8] = '\0';
        in_stack_00000010[9] = '\0';
        in_stack_00000010[10] = '\x02';
        in_stack_00000010[0xb] = '\0';
        in_stack_00000010[0xc] = 'U';
        in_stack_00000010[0xd] = 'C';
        in_stack_00000010[0xe] = 'o';
        in_stack_00000010[0xf] = 'l';
        *(ulong *)(in_stack_00000010 + 0x10) = CONCAT44(header.info.dataFormat,5);
        memset(in_stack_00000010 + 0x18,0,(long)((int)header.info.formatVersion + -0x18));
        in_stack_00000010 = in_stack_00000010 + (int)header.info.formatVersion;
        in_stack_00000018 = in_stack_00000018 - (int)header.info.formatVersion;
      }
    }
    else {
      header.info.formatVersion[0] = '\0';
      header.info.formatVersion[1] = '\0';
      header.info.formatVersion[2] = '\0';
      header.info.formatVersion[3] = '\0';
    }
    *in_stack_00000008 = local_38;
    in_stack_00000008[1] = *(uint *)(__n + 0x38) | local_a4 | in_RCX->options;
    in_stack_00000008[2] = 0;
    in_stack_00000008[3] = 0;
    if ((unsafeBackwardSet._87_1_ == '\0') ||
       ((cVar2 == '\0' && (*(long *)(__n + 0x28) == *(long *)(lVar1 + 0x28))))) {
      in_stack_00000008[4] = -1;
    }
    else {
      in_stack_00000008[4] = (int32_t)(*(long *)(__n + 0x28) - *(long *)(__n + 8) >> 2);
    }
    in_stack_00000008[5] = local_38 * 4;
    length = local_e4 * 4 + local_38 * 4;
    in_stack_00000008[6] = length;
    if (in_RCX->reorderTable != (uint8_t *)0x0) {
      length = length + 0x100;
    }
    in_stack_00000008[7] = length;
    if (unsafeBackwardSet._87_1_ != '\0') {
      errorCode2_1 = U_ZERO_ERROR;
      if (length < in_stack_00000018) {
        length_1 = utrie2_serialize_63(*(UTrie2 **)__n,in_stack_00000010 + length,
                                       in_stack_00000018 - length,&errorCode2_1);
      }
      else {
        length_1 = utrie2_serialize_63(*(UTrie2 **)__n,(void *)0x0,0,&errorCode2_1);
      }
      UVar3 = ::U_FAILURE(errorCode2_1);
      if ((UVar3 != '\0') && (errorCode2_1 != U_BUFFER_OVERFLOW_ERROR)) {
        *in_stack_00000020 = errorCode2_1;
        dataVersion_local._4_4_ = 0;
        header.info.dataVersion[0] = '\x01';
        header.info.dataVersion[1] = '\0';
        header.info.dataVersion[2] = '\0';
        header.info.dataVersion[3] = '\0';
        goto LAB_0030f84a;
      }
      length = length_1 + length;
    }
    in_stack_00000008[8] = length;
    in_stack_00000008[9] = length;
    if ((unsafeBackwardSet._87_1_ != '\0') && (*(int *)(__n + 0x40) != 0)) {
      length = *(int *)(__n + 0x40) * 8 + length;
    }
    in_stack_00000008[10] = length;
    in_stack_00000008[0xb] = length;
    if (unsafeBackwardSet._87_1_ != '\0') {
      length = *(int *)(__n + 0x3c) * 4 + length;
    }
    in_stack_00000008[0xc] = length;
    length = in_R9D * 4 + length;
    in_stack_00000008[0xd] = length;
    if (unsafeBackwardSet._87_1_ != '\0') {
      length = *(int *)(__n + 0x44) * 2 + length;
    }
    in_stack_00000008[0xe] = length;
    if ((unsafeBackwardSet._87_1_ != '\0') &&
       (UVar3 = UnicodeSet::isEmpty((UnicodeSet *)&baseData), UVar3 == '\0')) {
      p._4_4_ = U_ZERO_ERROR;
      if (length < in_stack_00000018) {
        scripts.fUnion._48_8_ = in_stack_00000010 + length;
        p._0_4_ = UnicodeSet::serialize
                            ((UnicodeSet *)&baseData,(uint16_t *)scripts.fUnion._48_8_,
                             (in_stack_00000018 - length) / 2,(UErrorCode *)((long)&p + 4));
      }
      else {
        p._0_4_ = UnicodeSet::serialize
                            ((UnicodeSet *)&baseData,(uint16_t *)0x0,0,(UErrorCode *)((long)&p + 4))
        ;
      }
      UVar3 = ::U_FAILURE(p._4_4_);
      if ((UVar3 != '\0') && (p._4_4_ != U_BUFFER_OVERFLOW_ERROR)) {
        *in_stack_00000020 = p._4_4_;
        dataVersion_local._4_4_ = 0;
        header.info.dataVersion[0] = '\x01';
        header.info.dataVersion[1] = '\0';
        header.info.dataVersion[2] = '\0';
        header.info.dataVersion[3] = '\0';
        goto LAB_0030f84a;
      }
      length = (int32_t)p * 2 + length;
    }
    in_stack_00000008[0xf] = length;
    length = length + local_a8 * 2;
    UnicodeString::UnicodeString((UnicodeString *)local_168);
    in_stack_00000008[0x10] = length;
    if (cVar2 != '\0') {
      UnicodeString::append((UnicodeString *)local_168,*(char16_t *)(__n + 100));
      ConstChar16Ptr::ConstChar16Ptr(&local_170,*(char16_t **)(__n + 0x68));
      UnicodeString::append((UnicodeString *)local_168,&local_170,*(int *)(__n + 100) + 0x10);
      ConstChar16Ptr::~ConstChar16Ptr(&local_170);
      ConstChar16Ptr::ConstChar16Ptr(&local_178,*(char16_t **)(__n + 0x70));
      UnicodeString::append((UnicodeString *)local_168,&local_178,*(int32_t *)(__n + 0x78));
      ConstChar16Ptr::~ConstChar16Ptr(&local_178);
      iVar4 = UnicodeString::length((UnicodeString *)local_168);
      length = iVar4 * 2 + length;
    }
    in_stack_00000008[0x11] = length;
    if (cVar2 != '\0') {
      length = length + 0x100;
    }
    in_stack_00000008[0x12] = length;
    in_stack_00000008[0x13] = length;
    if (in_stack_00000018 < length) {
      *in_stack_00000020 = U_BUFFER_OVERFLOW_ERROR;
      dataVersion_local._4_4_ = (int)header.info.formatVersion + length;
    }
    else {
      memcpy(in_stack_00000010,in_stack_00000008,(long)(local_38 << 2));
      copyData(in_stack_00000008,5,_i,in_stack_00000010);
      copyData(in_stack_00000008,6,in_RCX->reorderTable,in_stack_00000010);
      copyData(in_stack_00000008,9,*(void **)(__n + 0x10),in_stack_00000010);
      copyData(in_stack_00000008,0xb,*(void **)(__n + 8),in_stack_00000010);
      copyData(in_stack_00000008,0xc,in_R8,in_stack_00000010);
      copyData(in_stack_00000008,0xd,*(void **)(__n + 0x18),in_stack_00000010);
      copyData(in_stack_00000008,0xf,*(void **)(__n + 0x58),in_stack_00000010);
      src = UnicodeString::getBuffer((UnicodeString *)local_168);
      copyData(in_stack_00000008,0x10,src,in_stack_00000010);
      copyData(in_stack_00000008,0x11,*(void **)(__n + 0x48),in_stack_00000010);
      dataVersion_local._4_4_ = (int)header.info.formatVersion + length;
    }
    header.info.dataVersion[0] = '\x01';
    header.info.dataVersion[1] = '\0';
    header.info.dataVersion[2] = '\0';
    header.info.dataVersion[3] = '\0';
    UnicodeString::~UnicodeString((UnicodeString *)local_168);
  }
  else {
    CollationData::makeReorderRanges
              ((CollationData *)__n,_i,local_e4,(UVector32 *)&reorderCodes,in_stack_00000020);
    for (headerSize = 0; headerSize < local_e4; headerSize = headerSize + 1) {
      UVector32::insertElementAt
                ((UVector32 *)&reorderCodes,_i[headerSize],headerSize,in_stack_00000020);
    }
    UVar3 = ::U_FAILURE(*in_stack_00000020);
    if (UVar3 == '\0') {
      _i = UVector32::getBuffer((UVector32 *)&reorderCodes);
      local_e4 = UVector32::size((UVector32 *)&reorderCodes);
      goto LAB_0030f01f;
    }
    dataVersion_local._4_4_ = 0;
    header.info.dataVersion[0] = '\x01';
    header.info.dataVersion[1] = '\0';
    header.info.dataVersion[2] = '\0';
    header.info.dataVersion[3] = '\0';
  }
LAB_0030f84a:
  UVector32::~UVector32((UVector32 *)&reorderCodes);
  UnicodeSet::~UnicodeSet((UnicodeSet *)&baseData);
LAB_0030f87e:
  return (ulong)dataVersion_local._4_4_;
}

Assistant:

int32_t
CollationDataWriter::write(UBool isBase, const UVersionInfo dataVersion,
                           const CollationData &data, const CollationSettings &settings,
                           const void *rootElements, int32_t rootElementsLength,
                           int32_t indexes[], uint8_t *dest, int32_t capacity,
                           UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    if(capacity < 0 || (capacity > 0 && dest == NULL)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    // Figure out which data items to write before settling on
    // the indexes length and writing offsets.
    // For any data item, we need to write the start and limit offsets,
    // so the indexes length must be at least index-of-start-offset + 2.
    int32_t indexesLength;
    UBool hasMappings;
    UnicodeSet unsafeBackwardSet;
    const CollationData *baseData = data.base;

    int32_t fastLatinVersion;
    if(data.fastLatinTable != NULL) {
        fastLatinVersion = (int32_t)CollationFastLatin::VERSION << 16;
    } else {
        fastLatinVersion = 0;
    }
    int32_t fastLatinTableLength = 0;

    if(isBase) {
        // For the root collator, we write an even number of indexes
        // so that we start with an 8-aligned offset.
        indexesLength = CollationDataReader::IX_TOTAL_SIZE + 1;
        U_ASSERT(settings.reorderCodesLength == 0);
        hasMappings = TRUE;
        unsafeBackwardSet = *data.unsafeBackwardSet;
        fastLatinTableLength = data.fastLatinTableLength;
    } else if(baseData == NULL) {
        hasMappings = FALSE;
        if(settings.reorderCodesLength == 0) {
            // only options
            indexesLength = CollationDataReader::IX_OPTIONS + 1;  // no limit offset here
        } else {
            // only options, reorder codes, and the reorder table
            indexesLength = CollationDataReader::IX_REORDER_TABLE_OFFSET + 2;
        }
    } else {
        hasMappings = TRUE;
        // Tailored mappings, and what else?
        // Check in ascending order of optional tailoring data items.
        indexesLength = CollationDataReader::IX_CE32S_OFFSET + 2;
        if(data.contextsLength != 0) {
            indexesLength = CollationDataReader::IX_CONTEXTS_OFFSET + 2;
        }
        unsafeBackwardSet.addAll(*data.unsafeBackwardSet).removeAll(*baseData->unsafeBackwardSet);
        if(!unsafeBackwardSet.isEmpty()) {
            indexesLength = CollationDataReader::IX_UNSAFE_BWD_OFFSET + 2;
        }
        if(data.fastLatinTable != baseData->fastLatinTable) {
            fastLatinTableLength = data.fastLatinTableLength;
            indexesLength = CollationDataReader::IX_FAST_LATIN_TABLE_OFFSET + 2;
        }
    }

    UVector32 codesAndRanges(errorCode);
    const int32_t *reorderCodes = settings.reorderCodes;
    int32_t reorderCodesLength = settings.reorderCodesLength;
    if(settings.hasReordering() &&
            CollationSettings::reorderTableHasSplitBytes(settings.reorderTable)) {
        // Rebuild the full list of reorder ranges.
        // The list in the settings is truncated for efficiency.
        data.makeReorderRanges(reorderCodes, reorderCodesLength, codesAndRanges, errorCode);
        // Write the codes, then the ranges.
        for(int32_t i = 0; i < reorderCodesLength; ++i) {
            codesAndRanges.insertElementAt(reorderCodes[i], i, errorCode);
        }
        if(U_FAILURE(errorCode)) { return 0; }
        reorderCodes = codesAndRanges.getBuffer();
        reorderCodesLength = codesAndRanges.size();
    }

    int32_t headerSize;
    if(isBase) {
        headerSize = 0;  // udata_create() writes the header
    } else {
        DataHeader header;
        header.dataHeader.magic1 = 0xda;
        header.dataHeader.magic2 = 0x27;
        uprv_memcpy(&header.info, &dataInfo, sizeof(UDataInfo));
        uprv_memcpy(header.info.dataVersion, dataVersion, sizeof(UVersionInfo));
        headerSize = (int32_t)sizeof(header);
        U_ASSERT((headerSize & 3) == 0);  // multiple of 4 bytes
        if(hasMappings && data.cesLength != 0) {
            // Sum of the sizes of the data items which are
            // not automatically multiples of 8 bytes and which are placed before the CEs.
            int32_t sum = headerSize + (indexesLength + reorderCodesLength) * 4;
            if((sum & 7) != 0) {
                // We need to add padding somewhere so that the 64-bit CEs are 8-aligned.
                // We add to the header size here.
                // Alternatively, we could increment the indexesLength
                // or add a few bytes to the reorderTable.
                headerSize += 4;
            }
        }
        header.dataHeader.headerSize = (uint16_t)headerSize;
        if(headerSize <= capacity) {
            uprv_memcpy(dest, &header, sizeof(header));
            // Write 00 bytes so that the padding is not mistaken for a copyright string.
            uprv_memset(dest + sizeof(header), 0, headerSize - (int32_t)sizeof(header));
            dest += headerSize;
            capacity -= headerSize;
        } else {
            dest = NULL;
            capacity = 0;
        }
    }

    indexes[CollationDataReader::IX_INDEXES_LENGTH] = indexesLength;
    U_ASSERT((settings.options & ~0xffff) == 0);
    indexes[CollationDataReader::IX_OPTIONS] =
            data.numericPrimary | fastLatinVersion | settings.options;
    indexes[CollationDataReader::IX_RESERVED2] = 0;
    indexes[CollationDataReader::IX_RESERVED3] = 0;

    // Byte offsets of data items all start from the start of the indexes.
    // We add the headerSize at the very end.
    int32_t totalSize = indexesLength * 4;

    if(hasMappings && (isBase || data.jamoCE32s != baseData->jamoCE32s)) {
        indexes[CollationDataReader::IX_JAMO_CE32S_START] = static_cast<int32_t>(data.jamoCE32s - data.ce32s);
    } else {
        indexes[CollationDataReader::IX_JAMO_CE32S_START] = -1;
    }

    indexes[CollationDataReader::IX_REORDER_CODES_OFFSET] = totalSize;
    totalSize += reorderCodesLength * 4;

    indexes[CollationDataReader::IX_REORDER_TABLE_OFFSET] = totalSize;
    if(settings.reorderTable != NULL) {
        totalSize += 256;
    }

    indexes[CollationDataReader::IX_TRIE_OFFSET] = totalSize;
    if(hasMappings) {
        UErrorCode errorCode2 = U_ZERO_ERROR;
        int32_t length;
        if(totalSize < capacity) {
            length = utrie2_serialize(data.trie, dest + totalSize,
                                      capacity - totalSize, &errorCode2);
        } else {
            length = utrie2_serialize(data.trie, NULL, 0, &errorCode2);
        }
        if(U_FAILURE(errorCode2) && errorCode2 != U_BUFFER_OVERFLOW_ERROR) {
            errorCode = errorCode2;
            return 0;
        }
        // The trie size should be a multiple of 8 bytes due to the way
        // compactIndex2(UNewTrie2 *trie) currently works.
        U_ASSERT((length & 7) == 0);
        totalSize += length;
    }

    indexes[CollationDataReader::IX_RESERVED8_OFFSET] = totalSize;
    indexes[CollationDataReader::IX_CES_OFFSET] = totalSize;
    if(hasMappings && data.cesLength != 0) {
        U_ASSERT(((headerSize + totalSize) & 7) == 0);
        totalSize += data.cesLength * 8;
    }

    indexes[CollationDataReader::IX_RESERVED10_OFFSET] = totalSize;
    indexes[CollationDataReader::IX_CE32S_OFFSET] = totalSize;
    if(hasMappings) {
        totalSize += data.ce32sLength * 4;
    }

    indexes[CollationDataReader::IX_ROOT_ELEMENTS_OFFSET] = totalSize;
    totalSize += rootElementsLength * 4;

    indexes[CollationDataReader::IX_CONTEXTS_OFFSET] = totalSize;
    if(hasMappings) {
        totalSize += data.contextsLength * 2;
    }

    indexes[CollationDataReader::IX_UNSAFE_BWD_OFFSET] = totalSize;
    if(hasMappings && !unsafeBackwardSet.isEmpty()) {
        UErrorCode errorCode2 = U_ZERO_ERROR;
        int32_t length;
        if(totalSize < capacity) {
            uint16_t *p = reinterpret_cast<uint16_t *>(dest + totalSize);
            length = unsafeBackwardSet.serialize(
                    p, (capacity - totalSize) / 2, errorCode2);
        } else {
            length = unsafeBackwardSet.serialize(NULL, 0, errorCode2);
        }
        if(U_FAILURE(errorCode2) && errorCode2 != U_BUFFER_OVERFLOW_ERROR) {
            errorCode = errorCode2;
            return 0;
        }
        totalSize += length * 2;
    }

    indexes[CollationDataReader::IX_FAST_LATIN_TABLE_OFFSET] = totalSize;
    totalSize += fastLatinTableLength * 2;

    UnicodeString scripts;
    indexes[CollationDataReader::IX_SCRIPTS_OFFSET] = totalSize;
    if(isBase) {
        scripts.append((UChar)data.numScripts);
        scripts.append(reinterpret_cast<const UChar *>(data.scriptsIndex), data.numScripts + 16);
        scripts.append(reinterpret_cast<const UChar *>(data.scriptStarts), data.scriptStartsLength);
        totalSize += scripts.length() * 2;
    }

    indexes[CollationDataReader::IX_COMPRESSIBLE_BYTES_OFFSET] = totalSize;
    if(isBase) {
        totalSize += 256;
    }

    indexes[CollationDataReader::IX_RESERVED18_OFFSET] = totalSize;
    indexes[CollationDataReader::IX_TOTAL_SIZE] = totalSize;

    if(totalSize > capacity) {
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return headerSize + totalSize;
    }

    uprv_memcpy(dest, indexes, indexesLength * 4);
    copyData(indexes, CollationDataReader::IX_REORDER_CODES_OFFSET, reorderCodes, dest);
    copyData(indexes, CollationDataReader::IX_REORDER_TABLE_OFFSET, settings.reorderTable, dest);
    // The trie has already been serialized into the dest buffer.
    copyData(indexes, CollationDataReader::IX_CES_OFFSET, data.ces, dest);
    copyData(indexes, CollationDataReader::IX_CE32S_OFFSET, data.ce32s, dest);
    copyData(indexes, CollationDataReader::IX_ROOT_ELEMENTS_OFFSET, rootElements, dest);
    copyData(indexes, CollationDataReader::IX_CONTEXTS_OFFSET, data.contexts, dest);
    // The unsafeBackwardSet has already been serialized into the dest buffer.
    copyData(indexes, CollationDataReader::IX_FAST_LATIN_TABLE_OFFSET, data.fastLatinTable, dest);
    copyData(indexes, CollationDataReader::IX_SCRIPTS_OFFSET, scripts.getBuffer(), dest);
    copyData(indexes, CollationDataReader::IX_COMPRESSIBLE_BYTES_OFFSET, data.compressibleBytes, dest);

    return headerSize + totalSize;
}